

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O2

bool_t prf_group_load_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  pool_t pool_id;
  uint uVar1;
  uint8_t uVar2;
  uint16_t uVar3;
  int16_t iVar4;
  uint32_t uVar5;
  int32_t iVar6;
  uint8_t *buffer;
  ushort uVar7;
  uint len;
  node_data_conflict2 *data;
  
  uVar3 = bf_get_uint16_be(bfile);
  node->opcode = uVar3;
  if (uVar3 == prf_group_info.opcode) {
    uVar3 = bf_get_uint16_be(bfile);
    node->length = uVar3;
    if (uVar3 < 0x1c) {
      prf_error(3,"no support for so short (%d bytes) group nodes.");
    }
    else {
      buffer = node->data;
      if (buffer != (uint8_t *)0x0) {
LAB_00105b53:
        bf_read(bfile,buffer,8);
        iVar4 = bf_get_int16_be(bfile);
        *(int16_t *)(buffer + 8) = iVar4;
        iVar4 = bf_get_int16_be(bfile);
        *(int16_t *)(buffer + 10) = iVar4;
        uVar5 = bf_get_uint32_be(bfile);
        *(uint32_t *)(buffer + 0xc) = uVar5;
        iVar4 = bf_get_int16_be(bfile);
        *(int16_t *)(buffer + 0x10) = iVar4;
        iVar4 = bf_get_int16_be(bfile);
        *(int16_t *)(buffer + 0x12) = iVar4;
        iVar4 = bf_get_int16_be(bfile);
        *(int16_t *)(buffer + 0x14) = iVar4;
        uVar2 = bf_get_int8(bfile);
        buffer[0x16] = uVar2;
        uVar2 = bf_get_int8(bfile);
        buffer[0x17] = uVar2;
        uVar7 = node->length;
        if (uVar7 < 0x20) {
          uVar1 = 0x1c;
        }
        else {
          iVar6 = bf_get_int32_be(bfile);
          *(int32_t *)(buffer + 0x18) = iVar6;
          uVar7 = node->length;
          uVar1 = 0x20;
        }
        len = uVar7 - uVar1;
        if (uVar7 < uVar1 || len == 0) {
          return 1;
        }
        bf_read(bfile,node->data + ((ulong)uVar1 - 4),len);
        return 1;
      }
      pool_id = state->model->mempool_id;
      if (pool_id == 0) {
        buffer = (uint8_t *)malloc((ulong)(uVar3 - 4));
      }
      else {
        buffer = (uint8_t *)pool_malloc(pool_id,uVar3 - 4);
      }
      node->data = buffer;
      if (buffer != (uint8_t *)0x0) goto LAB_00105b53;
      prf_error(9,"memory allocation problem (returned NULL)");
    }
    uVar1 = 4;
  }
  else {
    prf_error(9,"tried group load method for node of type %d.",(ulong)uVar3);
    uVar1 = 2;
  }
  bf_rewind(bfile,uVar1);
  return 0;
}

Assistant:

static
bool_t
prf_group_load_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile )
{
    int pos;

    assert( node != NULL && state != NULL && bfile != NULL );

    node->opcode = bf_get_uint16_be( bfile );
    if ( node->opcode != prf_group_info.opcode ) {
        prf_error( 9, "tried group load method for node of type %d.",
            node->opcode );
        bf_rewind( bfile, 2 );
        return FALSE;
    }

    node->length = bf_get_uint16_be( bfile );
    if ( node->length < 28 ) {
        prf_error( 3, "no support for so short (%d bytes) group nodes.",
            node->length );
        bf_rewind( bfile, 4 );
        return FALSE;
    }

    if ( node->length > 4 && node->data == NULL ) {
        assert( state->model != NULL );
        if ( state->model->mempool_id == 0 )
             node->data = (uint8_t *)malloc( node->length-4+NODE_DATA_PAD );
        else
            node->data = (uint8_t *)pool_malloc( state->model->mempool_id,
                node->length - 4 + NODE_DATA_PAD );
        if ( node->data == NULL ) {
            prf_error( 9, "memory allocation problem (returned NULL)" );
            bf_rewind( bfile, 4 );
            return FALSE;
        }
    }

    pos = 4;
    do {
        node_data * data;
        data = (node_data *) node->data;

        bf_read( bfile, (uint8_t *) data->ascii_id, 8 ); pos += 8;
        data->relative_priority = bf_get_int16_be( bfile ); pos += 2;
        data->reserved1 = bf_get_int16_be( bfile ); pos += 2;
        data->flags = bf_get_uint32_be( bfile ); pos += 4;
        data->special_effect_id1 = bf_get_int16_be( bfile ); pos += 2;
        data->special_effect_id2 = bf_get_int16_be( bfile ); pos += 2;
        data->significance = bf_get_int16_be( bfile ); pos += 2;
        data->layer_code = bf_get_int8( bfile ); pos += 1;
        data->reserved2 = bf_get_int8( bfile ); pos += 1;
        if ( node->length < (pos + 4) ) break;
        data->reserved3 = bf_get_int32_be( bfile ); pos += 4;
    } while ( FALSE );

    if ( node->length > pos )
        pos += bf_read( bfile, node->data + pos - 4 + NODE_DATA_PAD,
            node->length - pos );

    return TRUE;
}